

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

QVariant * __thiscall
QMimeDataPrivate::getData(QVariant *__return_storage_ptr__,QMimeDataPrivate *this,QString *format)

{
  iterator iVar1;
  
  iVar1 = find(this,format);
  if (iVar1._M_current ==
      (this->dataList).super__Vector_base<QMimeDataStruct,_std::allocator<QMimeDataStruct>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    ::QVariant::QVariant(__return_storage_ptr__,&(iVar1._M_current)->data);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QMimeDataPrivate::getData(const QString &format) const
{
    const auto it = find(format);
    if (it == dataList.cend())
        return {};
    else
        return it->data;
}